

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O3

void __thiscall RString::ToLowerCase(RString *this)

{
  byte *pbVar1;
  long lVar2;
  byte bVar3;
  byte *pbVar4;
  
  pbVar1 = (byte *)this->myString;
  if ('\0' < (char)pbVar1[-1]) {
    CloneString(this);
    pbVar1 = (byte *)this->myString;
  }
  bVar3 = *pbVar1;
  if (bVar3 != 0) {
    lVar2 = 1;
    pbVar4 = pbVar1;
    do {
      if ((byte)(bVar3 + 0xbf) < 0x1a) {
        *pbVar4 = bVar3 | 0x20;
        pbVar1 = (byte *)this->myString;
      }
      pbVar4 = pbVar1 + lVar2;
      bVar3 = pbVar1[lVar2];
      lVar2 = lVar2 + 1;
    } while (bVar3 != 0);
  }
  return;
}

Assistant:

void RString::ToLowerCase(void)
{
	PrepForMod();

	for(int i = 0; *(myString + i) != '\0'; i++)
		if(*(myString + i) >= 'A' && *(myString + i) <= 'Z')
			*(myString + i) += 'a' - 'A';
}